

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

DP_RS_Stream
MpiInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
             attr_list WriterContact,SstStats Stats)

{
  undefined8 *puVar1;
  CManager p_Var2;
  SMPI_Comm comm;
  uint64_t uVar3;
  undefined8 uVar4;
  
  puVar1 = (undefined8 *)calloc(0x90,1);
  p_Var2 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  *puVar1 = CP_Stream;
  uVar3 = GetUniqueTaskId();
  puVar1[2] = uVar3;
  puVar1[5] = Stats;
  SMPI_Comm_rank(comm,(int *)(puVar1 + 1));
  uVar4 = CMregister_format(p_Var2,MpiReadRequestStructs);
  puVar1[6] = uVar4;
  uVar4 = CMregister_format(p_Var2,MpiReadReplyStructs);
  CMregister_handler(uVar4,MpiReadReplyHandler,Svcs);
  snprintf((char *)(puVar1 + 7),0x40,"Reader Rank %d",(ulong)*(uint *)(puVar1 + 1));
  puVar1[0xf] = puVar1;
  *ReaderContactInfoPtr = puVar1 + 7;
  (*Svcs->verbose)((void *)*puVar1,5,"MPI dataplane reader initialized, reader rank %d\n",
                   (ulong)*(uint *)(puVar1 + 1));
  return puVar1;
}

Assistant:

static DP_RS_Stream MpiInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                  struct _SstParams *Params, attr_list WriterContact,
                                  SstStats Stats)
{
    MpiStreamRD Stream = calloc(sizeof(struct _MpiStreamRD), 1);
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    Stream->Stream.CP_Stream = CP_Stream;
    Stream->Stream.taskID = GetUniqueTaskId();
    Stream->Link.Stats = Stats;

    SMPI_Comm_rank(comm, &Stream->Stream.Rank);

    /* add a handler for read reply messages */
    Stream->ReadRequestFormat = CMregister_format(cm, MpiReadRequestStructs);
    F = CMregister_format(cm, MpiReadReplyStructs);
    CMregister_handler(F, MpiReadReplyHandler, Svcs);

    /* Generate Contact info */
    snprintf(Stream->MyContactInfo.ContactString, MPI_DP_CONTACT_STRING_LEN, "Reader Rank %d",
             Stream->Stream.Rank);
    Stream->MyContactInfo.StreamRS = Stream;
    *ReaderContactInfoPtr = &Stream->MyContactInfo;

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                  "MPI dataplane reader initialized, reader rank %d\n", Stream->Stream.Rank);

    return Stream;
}